

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O2

void __thiscall SQSharedState::Init(SQSharedState *this)

{
  sqvector<SQObjectPtr> *psVar1;
  SQUnsignedInteger SVar2;
  SQStringTable *this_00;
  SQObjectPtrVec *pSVar3;
  SQTable *pSVar4;
  SQString *pSVar5;
  SQObjectPtr local_28;
  
  this->_gc_chain = (SQCollectable_conflict *)0x0;
  this->_scratchpad = (SQChar *)0x0;
  this->_scratchpadsize = 0;
  this_00 = (SQStringTable *)sq_vm_malloc(0x20);
  this->_stringtable = this_00;
  SQStringTable::SQStringTable(this_00,this);
  pSVar3 = (SQObjectPtrVec *)sq_vm_malloc(0x18);
  this->_metamethods = pSVar3;
  pSVar3->_vals = (SQObjectPtr *)0x0;
  pSVar3->_size = 0;
  pSVar3->_allocated = 0;
  pSVar3 = (SQObjectPtrVec *)sq_vm_malloc(0x18);
  this->_systemstrings = pSVar3;
  pSVar3->_vals = (SQObjectPtr *)0x0;
  pSVar3->_size = 0;
  pSVar3->_allocated = 0;
  pSVar3 = (SQObjectPtrVec *)sq_vm_malloc(0x18);
  this->_types = pSVar3;
  pSVar3->_vals = (SQObjectPtr *)0x0;
  pSVar3->_size = 0;
  pSVar3->_allocated = 0;
  pSVar4 = SQTable::Create(this,0x11);
  SQObjectPtr::operator=(&this->_metamethodsmap,pSVar4);
  psVar1 = this->_systemstrings;
  pSVar5 = SQString::Create(this,"null",-1);
  SQObjectPtr::SQObjectPtr(&local_28,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  psVar1 = this->_systemstrings;
  pSVar5 = SQString::Create(this,"table",-1);
  SQObjectPtr::SQObjectPtr(&local_28,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  psVar1 = this->_systemstrings;
  pSVar5 = SQString::Create(this,"array",-1);
  SQObjectPtr::SQObjectPtr(&local_28,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  psVar1 = this->_systemstrings;
  pSVar5 = SQString::Create(this,"closure",-1);
  SQObjectPtr::SQObjectPtr(&local_28,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  psVar1 = this->_systemstrings;
  pSVar5 = SQString::Create(this,"string",-1);
  SQObjectPtr::SQObjectPtr(&local_28,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  psVar1 = this->_systemstrings;
  pSVar5 = SQString::Create(this,"userdata",-1);
  SQObjectPtr::SQObjectPtr(&local_28,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  psVar1 = this->_systemstrings;
  pSVar5 = SQString::Create(this,"integer",-1);
  SQObjectPtr::SQObjectPtr(&local_28,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  psVar1 = this->_systemstrings;
  pSVar5 = SQString::Create(this,"float",-1);
  SQObjectPtr::SQObjectPtr(&local_28,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  psVar1 = this->_systemstrings;
  pSVar5 = SQString::Create(this,"userpointer",-1);
  SQObjectPtr::SQObjectPtr(&local_28,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  psVar1 = this->_systemstrings;
  pSVar5 = SQString::Create(this,"function",-1);
  SQObjectPtr::SQObjectPtr(&local_28,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  psVar1 = this->_systemstrings;
  pSVar5 = SQString::Create(this,"generator",-1);
  SQObjectPtr::SQObjectPtr(&local_28,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  psVar1 = this->_systemstrings;
  pSVar5 = SQString::Create(this,"thread",-1);
  SQObjectPtr::SQObjectPtr(&local_28,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  psVar1 = this->_systemstrings;
  pSVar5 = SQString::Create(this,"class",-1);
  SQObjectPtr::SQObjectPtr(&local_28,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  psVar1 = this->_systemstrings;
  pSVar5 = SQString::Create(this,"instance",-1);
  SQObjectPtr::SQObjectPtr(&local_28,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  psVar1 = this->_systemstrings;
  pSVar5 = SQString::Create(this,"bool",-1);
  SQObjectPtr::SQObjectPtr(&local_28,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  psVar1 = this->_metamethods;
  pSVar5 = SQString::Create(this,"_add",-1);
  SQObjectPtr::SQObjectPtr(&local_28,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  SVar2 = this->_metamethods->_size;
  local_28.super_SQObject._unVal.pTable = (SQTable *)(SVar2 - 1);
  local_28.super_SQObject._type = OT_INTEGER;
  SQTable::NewSlot((this->_metamethodsmap).super_SQObject._unVal.pTable,
                   this->_metamethods->_vals + (SVar2 - 1),&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  psVar1 = this->_metamethods;
  pSVar5 = SQString::Create(this,"_sub",-1);
  SQObjectPtr::SQObjectPtr(&local_28,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  SVar2 = this->_metamethods->_size;
  local_28.super_SQObject._unVal.pTable = (SQTable *)(SVar2 - 1);
  local_28.super_SQObject._type = OT_INTEGER;
  SQTable::NewSlot((this->_metamethodsmap).super_SQObject._unVal.pTable,
                   this->_metamethods->_vals + (SVar2 - 1),&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  psVar1 = this->_metamethods;
  pSVar5 = SQString::Create(this,"_mul",-1);
  SQObjectPtr::SQObjectPtr(&local_28,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  SVar2 = this->_metamethods->_size;
  local_28.super_SQObject._unVal.pTable = (SQTable *)(SVar2 - 1);
  local_28.super_SQObject._type = OT_INTEGER;
  SQTable::NewSlot((this->_metamethodsmap).super_SQObject._unVal.pTable,
                   this->_metamethods->_vals + (SVar2 - 1),&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  psVar1 = this->_metamethods;
  pSVar5 = SQString::Create(this,"_div",-1);
  SQObjectPtr::SQObjectPtr(&local_28,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  SVar2 = this->_metamethods->_size;
  local_28.super_SQObject._unVal.pTable = (SQTable *)(SVar2 - 1);
  local_28.super_SQObject._type = OT_INTEGER;
  SQTable::NewSlot((this->_metamethodsmap).super_SQObject._unVal.pTable,
                   this->_metamethods->_vals + (SVar2 - 1),&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  psVar1 = this->_metamethods;
  pSVar5 = SQString::Create(this,"_unm",-1);
  SQObjectPtr::SQObjectPtr(&local_28,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  SVar2 = this->_metamethods->_size;
  local_28.super_SQObject._unVal.pTable = (SQTable *)(SVar2 - 1);
  local_28.super_SQObject._type = OT_INTEGER;
  SQTable::NewSlot((this->_metamethodsmap).super_SQObject._unVal.pTable,
                   this->_metamethods->_vals + (SVar2 - 1),&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  psVar1 = this->_metamethods;
  pSVar5 = SQString::Create(this,"_modulo",-1);
  SQObjectPtr::SQObjectPtr(&local_28,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  SVar2 = this->_metamethods->_size;
  local_28.super_SQObject._unVal.pTable = (SQTable *)(SVar2 - 1);
  local_28.super_SQObject._type = OT_INTEGER;
  SQTable::NewSlot((this->_metamethodsmap).super_SQObject._unVal.pTable,
                   this->_metamethods->_vals + (SVar2 - 1),&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  psVar1 = this->_metamethods;
  pSVar5 = SQString::Create(this,"_set",-1);
  SQObjectPtr::SQObjectPtr(&local_28,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  SVar2 = this->_metamethods->_size;
  local_28.super_SQObject._unVal.pTable = (SQTable *)(SVar2 - 1);
  local_28.super_SQObject._type = OT_INTEGER;
  SQTable::NewSlot((this->_metamethodsmap).super_SQObject._unVal.pTable,
                   this->_metamethods->_vals + (SVar2 - 1),&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  psVar1 = this->_metamethods;
  pSVar5 = SQString::Create(this,"_get",-1);
  SQObjectPtr::SQObjectPtr(&local_28,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  SVar2 = this->_metamethods->_size;
  local_28.super_SQObject._unVal.pTable = (SQTable *)(SVar2 - 1);
  local_28.super_SQObject._type = OT_INTEGER;
  SQTable::NewSlot((this->_metamethodsmap).super_SQObject._unVal.pTable,
                   this->_metamethods->_vals + (SVar2 - 1),&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  psVar1 = this->_metamethods;
  pSVar5 = SQString::Create(this,"_typeof",-1);
  SQObjectPtr::SQObjectPtr(&local_28,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  SVar2 = this->_metamethods->_size;
  local_28.super_SQObject._unVal.pTable = (SQTable *)(SVar2 - 1);
  local_28.super_SQObject._type = OT_INTEGER;
  SQTable::NewSlot((this->_metamethodsmap).super_SQObject._unVal.pTable,
                   this->_metamethods->_vals + (SVar2 - 1),&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  psVar1 = this->_metamethods;
  pSVar5 = SQString::Create(this,"_nexti",-1);
  SQObjectPtr::SQObjectPtr(&local_28,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  SVar2 = this->_metamethods->_size;
  local_28.super_SQObject._unVal.pTable = (SQTable *)(SVar2 - 1);
  local_28.super_SQObject._type = OT_INTEGER;
  SQTable::NewSlot((this->_metamethodsmap).super_SQObject._unVal.pTable,
                   this->_metamethods->_vals + (SVar2 - 1),&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  psVar1 = this->_metamethods;
  pSVar5 = SQString::Create(this,"_cmp",-1);
  SQObjectPtr::SQObjectPtr(&local_28,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  SVar2 = this->_metamethods->_size;
  local_28.super_SQObject._unVal.pTable = (SQTable *)(SVar2 - 1);
  local_28.super_SQObject._type = OT_INTEGER;
  SQTable::NewSlot((this->_metamethodsmap).super_SQObject._unVal.pTable,
                   this->_metamethods->_vals + (SVar2 - 1),&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  psVar1 = this->_metamethods;
  pSVar5 = SQString::Create(this,"_call",-1);
  SQObjectPtr::SQObjectPtr(&local_28,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  SVar2 = this->_metamethods->_size;
  local_28.super_SQObject._unVal.pTable = (SQTable *)(SVar2 - 1);
  local_28.super_SQObject._type = OT_INTEGER;
  SQTable::NewSlot((this->_metamethodsmap).super_SQObject._unVal.pTable,
                   this->_metamethods->_vals + (SVar2 - 1),&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  psVar1 = this->_metamethods;
  pSVar5 = SQString::Create(this,"_cloned",-1);
  SQObjectPtr::SQObjectPtr(&local_28,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  SVar2 = this->_metamethods->_size;
  local_28.super_SQObject._unVal.pTable = (SQTable *)(SVar2 - 1);
  local_28.super_SQObject._type = OT_INTEGER;
  SQTable::NewSlot((this->_metamethodsmap).super_SQObject._unVal.pTable,
                   this->_metamethods->_vals + (SVar2 - 1),&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  psVar1 = this->_metamethods;
  pSVar5 = SQString::Create(this,"_newslot",-1);
  SQObjectPtr::SQObjectPtr(&local_28,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  SVar2 = this->_metamethods->_size;
  local_28.super_SQObject._unVal.pTable = (SQTable *)(SVar2 - 1);
  local_28.super_SQObject._type = OT_INTEGER;
  SQTable::NewSlot((this->_metamethodsmap).super_SQObject._unVal.pTable,
                   this->_metamethods->_vals + (SVar2 - 1),&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  psVar1 = this->_metamethods;
  pSVar5 = SQString::Create(this,"_delslot",-1);
  SQObjectPtr::SQObjectPtr(&local_28,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  SVar2 = this->_metamethods->_size;
  local_28.super_SQObject._unVal.pTable = (SQTable *)(SVar2 - 1);
  local_28.super_SQObject._type = OT_INTEGER;
  SQTable::NewSlot((this->_metamethodsmap).super_SQObject._unVal.pTable,
                   this->_metamethods->_vals + (SVar2 - 1),&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  psVar1 = this->_metamethods;
  pSVar5 = SQString::Create(this,"_tostring",-1);
  SQObjectPtr::SQObjectPtr(&local_28,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  SVar2 = this->_metamethods->_size;
  local_28.super_SQObject._unVal.pTable = (SQTable *)(SVar2 - 1);
  local_28.super_SQObject._type = OT_INTEGER;
  SQTable::NewSlot((this->_metamethodsmap).super_SQObject._unVal.pTable,
                   this->_metamethods->_vals + (SVar2 - 1),&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  psVar1 = this->_metamethods;
  pSVar5 = SQString::Create(this,"_newmember",-1);
  SQObjectPtr::SQObjectPtr(&local_28,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  SVar2 = this->_metamethods->_size;
  local_28.super_SQObject._unVal.pTable = (SQTable *)(SVar2 - 1);
  local_28.super_SQObject._type = OT_INTEGER;
  SQTable::NewSlot((this->_metamethodsmap).super_SQObject._unVal.pTable,
                   this->_metamethods->_vals + (SVar2 - 1),&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  psVar1 = this->_metamethods;
  pSVar5 = SQString::Create(this,"_inherited",-1);
  SQObjectPtr::SQObjectPtr(&local_28,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  SVar2 = this->_metamethods->_size;
  local_28.super_SQObject._unVal.pTable = (SQTable *)(SVar2 - 1);
  local_28.super_SQObject._type = OT_INTEGER;
  SQTable::NewSlot((this->_metamethodsmap).super_SQObject._unVal.pTable,
                   this->_metamethods->_vals + (SVar2 - 1),&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar5 = SQString::Create(this,"constructor",-1);
  SQObjectPtr::operator=(&this->_constructoridx,pSVar5);
  pSVar4 = SQTable::Create(this,0);
  SQObjectPtr::operator=(&this->_registry,pSVar4);
  pSVar4 = SQTable::Create(this,0);
  SQObjectPtr::operator=(&this->_consts,pSVar4);
  pSVar4 = CreateDefaultDelegate(this,_table_default_delegate_funcz);
  SQObjectPtr::operator=(&this->_table_default_delegate,pSVar4);
  pSVar4 = CreateDefaultDelegate(this,_array_default_delegate_funcz);
  SQObjectPtr::operator=(&this->_array_default_delegate,pSVar4);
  pSVar4 = CreateDefaultDelegate(this,_string_default_delegate_funcz);
  SQObjectPtr::operator=(&this->_string_default_delegate,pSVar4);
  pSVar4 = CreateDefaultDelegate(this,_number_default_delegate_funcz);
  SQObjectPtr::operator=(&this->_number_default_delegate,pSVar4);
  pSVar4 = CreateDefaultDelegate(this,_closure_default_delegate_funcz);
  SQObjectPtr::operator=(&this->_closure_default_delegate,pSVar4);
  pSVar4 = CreateDefaultDelegate(this,_generator_default_delegate_funcz);
  SQObjectPtr::operator=(&this->_generator_default_delegate,pSVar4);
  pSVar4 = CreateDefaultDelegate(this,_thread_default_delegate_funcz);
  SQObjectPtr::operator=(&this->_thread_default_delegate,pSVar4);
  pSVar4 = CreateDefaultDelegate(this,_class_default_delegate_funcz);
  SQObjectPtr::operator=(&this->_class_default_delegate,pSVar4);
  pSVar4 = CreateDefaultDelegate(this,_instance_default_delegate_funcz);
  SQObjectPtr::operator=(&this->_instance_default_delegate,pSVar4);
  pSVar4 = CreateDefaultDelegate(this,_weakref_default_delegate_funcz);
  SQObjectPtr::operator=(&this->_weakref_default_delegate,pSVar4);
  return;
}

Assistant:

void SQSharedState::Init()
{
    _scratchpad=NULL;
    _scratchpadsize=0;
#ifndef NO_GARBAGE_COLLECTOR
    _gc_chain=NULL;
#endif
    _stringtable = (SQStringTable*)SQ_MALLOC(sizeof(SQStringTable));
    new (_stringtable) SQStringTable(this);
    sq_new(_metamethods,SQObjectPtrVec);
    sq_new(_systemstrings,SQObjectPtrVec);
    sq_new(_types,SQObjectPtrVec);
    _metamethodsmap = SQTable::Create(this,MT_LAST-1);
    //adding type strings to avoid memory trashing
    //types names
    newsysstring(_SC("null"));
    newsysstring(_SC("table"));
    newsysstring(_SC("array"));
    newsysstring(_SC("closure"));
    newsysstring(_SC("string"));
    newsysstring(_SC("userdata"));
    newsysstring(_SC("integer"));
    newsysstring(_SC("float"));
    newsysstring(_SC("userpointer"));
    newsysstring(_SC("function"));
    newsysstring(_SC("generator"));
    newsysstring(_SC("thread"));
    newsysstring(_SC("class"));
    newsysstring(_SC("instance"));
    newsysstring(_SC("bool"));
    //meta methods
    newmetamethod(MM_ADD);
    newmetamethod(MM_SUB);
    newmetamethod(MM_MUL);
    newmetamethod(MM_DIV);
    newmetamethod(MM_UNM);
    newmetamethod(MM_MODULO);
    newmetamethod(MM_SET);
    newmetamethod(MM_GET);
    newmetamethod(MM_TYPEOF);
    newmetamethod(MM_NEXTI);
    newmetamethod(MM_CMP);
    newmetamethod(MM_CALL);
    newmetamethod(MM_CLONED);
    newmetamethod(MM_NEWSLOT);
    newmetamethod(MM_DELSLOT);
    newmetamethod(MM_TOSTRING);
    newmetamethod(MM_NEWMEMBER);
    newmetamethod(MM_INHERITED);

    _constructoridx = SQString::Create(this,_SC("constructor"));
    _registry = SQTable::Create(this,0);
    _consts = SQTable::Create(this,0);
    _table_default_delegate = CreateDefaultDelegate(this,_table_default_delegate_funcz);
    _array_default_delegate = CreateDefaultDelegate(this,_array_default_delegate_funcz);
    _string_default_delegate = CreateDefaultDelegate(this,_string_default_delegate_funcz);
    _number_default_delegate = CreateDefaultDelegate(this,_number_default_delegate_funcz);
    _closure_default_delegate = CreateDefaultDelegate(this,_closure_default_delegate_funcz);
    _generator_default_delegate = CreateDefaultDelegate(this,_generator_default_delegate_funcz);
    _thread_default_delegate = CreateDefaultDelegate(this,_thread_default_delegate_funcz);
    _class_default_delegate = CreateDefaultDelegate(this,_class_default_delegate_funcz);
    _instance_default_delegate = CreateDefaultDelegate(this,_instance_default_delegate_funcz);
    _weakref_default_delegate = CreateDefaultDelegate(this,_weakref_default_delegate_funcz);
}